

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

bool process_output(DESCRIPTOR_DATA *d,bool fPrompt)

{
  CHAR_DATA *victim;
  char cVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  DESCRIPTOR_DATA *d_00;
  CHAR_DATA *pCVar6;
  char wound [100];
  char buf [4608];
  char acStack_1288 [112];
  char local_1218 [4608];
  
  if ((merc_down) || (d->showstr_point == (char *)0x0)) {
    if (d->pString == (char **)0x0) {
      if ((!fPrompt || merc_down) || (d->connected != 0)) goto LAB_002781db;
      pCVar6 = d->character;
      victim = pCVar6->fighting;
      if (victim != (CHAR_DATA *)0x0) {
        if (victim->max_hit < 1) {
          iVar4 = -1;
        }
        else {
          iVar4 = (victim->hit * 100) / (int)victim->max_hit;
        }
        pcVar5 = get_battle_condition(victim,iVar4);
        strcpy(acStack_1288,pcVar5);
        bVar2 = can_see(pCVar6,victim);
        if (bVar2) {
          bVar2 = is_npc(victim);
          if (bVar2) {
            pcVar5 = victim->short_descr;
          }
          else {
            pcVar5 = pers(victim,pCVar6);
          }
        }
        else {
          pcVar5 = "Someone";
        }
        sprintf(local_1218,"%s %s \n\r",pcVar5,acStack_1288);
        cVar1 = (char)local_1218._0_4_;
        cVar3 = cVar1 + -0x20;
        if (0x19 < (byte)(cVar1 + 0x9fU)) {
          cVar3 = cVar1;
        }
        local_1218[0] = cVar3;
        write_to_buffer(d,local_1218,0);
        bVar2 = is_immortal(pCVar6);
        if (bVar2) {
          sprintf(local_1218,"(Waiting: %d)\n\r",(ulong)(uint)((int)pCVar6->wait / 0xc));
          write_to_buffer(d,local_1218,0);
        }
      }
      pCVar6 = d->original;
      if (pCVar6 == (CHAR_DATA *)0x0) {
        pCVar6 = d->character;
      }
      if ((pCVar6->comm[0] & 0x800) == 0) {
        write_to_buffer(d,"\n\r",2);
      }
      bVar2 = is_npc(pCVar6);
      if ((bVar2) || (pCVar6->pcdata->entering_text != true)) {
        if ((pCVar6->comm[0] & 0x2000) != 0) {
          bust_a_prompt(d->character);
        }
      }
      else {
        write_to_buffer(d,": ",2);
      }
      if ((pCVar6->comm[0] & 0x8000) == 0) goto LAB_002781db;
      pcVar5 = go_ahead_str;
    }
    else {
      pcVar5 = "EDIT> ";
    }
  }
  else {
    pcVar5 = "[Hit Return to continue]\n\r";
  }
  write_to_buffer(d,pcVar5,0);
LAB_002781db:
  iVar4 = d->outtop;
  if (iVar4 == 0) {
    bVar2 = true;
  }
  else {
    d_00 = d->snoop_by;
    if (d_00 != (DESCRIPTOR_DATA *)0x0) {
      if (d->character != (CHAR_DATA *)0x0) {
        write_to_buffer(d_00,d->character->name,0);
        d_00 = d->snoop_by;
      }
      write_to_buffer(d_00,"> ",2);
      write_to_buffer(d->snoop_by,d->outbuf,d->outtop);
      iVar4 = d->outtop;
    }
    bVar2 = write_to_descriptor((int)d->descriptor,d->outbuf,iVar4);
    d->outtop = 0;
  }
  return bVar2;
}

Assistant:

bool process_output(DESCRIPTOR_DATA *d, bool fPrompt)
{
	/*
	 * Bust a prompt.
	 */
	if (!merc_down && d->showstr_point)
	{
		write_to_buffer(d, "[Hit Return to continue]\n\r", 0);
	}
	else if (d->pString != nullptr)
	{
		write_to_buffer(d, "EDIT> ", 0);
	}
	else if (!merc_down && fPrompt && d->connected == CON_PLAYING)
	{
		CHAR_DATA *ch;
		CHAR_DATA *victim;

		ch = d->character;

		/* battle prompt */
		if ((victim = ch->fighting) != nullptr)
		{
			int percent;
			char wound[100];
			char buf[MAX_STRING_LENGTH];

			if (victim->max_hit > 0)
				percent = victim->hit * 100 / victim->max_hit;
			else
				percent = -1;

			sprintf(wound, "%s", get_battle_condition(victim, percent));

			sprintf(buf, "%s %s \n\r",
				(can_see(ch, victim)) ? (is_npc(victim) ? victim->short_descr : pers(victim, ch)) : "Someone",
				wound);
			buf[0] = UPPER(buf[0]);
			write_to_buffer(d, buf, 0);

			if (is_immortal(ch))
			{
				sprintf(buf, "(Waiting: %d)\n\r", (ch->wait / PULSE_VIOLENCE));
				write_to_buffer(d, buf, 0);
			}
		}

		ch = d->original ? d->original : d->character;
		if (!IS_SET(ch->comm, COMM_COMPACT))
			write_to_buffer(d, "\n\r", 2);
		if (!is_npc(ch) && ch->pcdata->entering_text)
			write_to_buffer(d, ": ", 2);
		else if (IS_SET(ch->comm, COMM_PROMPT))
			bust_a_prompt(d->character);

		if (IS_SET(ch->comm, COMM_TELNET_GA))
			write_to_buffer(d, go_ahead_str, 0);
	}

	/*
	 * Short-circuit if nothing to write.
	 */
	if (d->outtop == 0)
		return true;

	/*
	 * Snoop-o-rama.
	 */
	if (d->snoop_by != nullptr)
	{
		if (d->character != nullptr)
			write_to_buffer(d->snoop_by, d->character->name, 0);

		write_to_buffer(d->snoop_by, "> ", 2);
		write_to_buffer(d->snoop_by, d->outbuf, d->outtop);
	}

	/*
	 * OS-dependent output.
	 *
	 * now done at output_buffer( ) to deal with color codes.
	 * - Wreck
	 */
	/*    return output_buffer( d );*/
	if (!write_to_descriptor(d->descriptor, d->outbuf, d->outtop))
	{
		d->outtop = 0;
		return false;
	}
	else
	{
		d->outtop = 0;
		return true;
	}
}